

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O3

StringRef __thiscall llvm::DataExtractor::getCStrRef(DataExtractor *this,uint64_t *offset_ptr)

{
  char *__s;
  ulong uVar1;
  ulong uVar2;
  void *pvVar3;
  long lVar4;
  size_t sVar5;
  size_t __n;
  char *pcVar6;
  StringRef SVar7;
  
  uVar1 = *offset_ptr;
  uVar2 = (this->Data).Length;
  sVar5 = 0;
  __n = uVar2 - uVar1;
  pcVar6 = (char *)0x0;
  if (uVar1 <= uVar2 && __n != 0) {
    pcVar6 = (this->Data).Data;
    __s = pcVar6 + uVar1;
    pvVar3 = memchr(__s,0,__n);
    lVar4 = (long)pvVar3 - (long)pcVar6;
    sVar5 = 0;
    pcVar6 = (char *)0x0;
    if (lVar4 != -1 && pvVar3 != (void *)0x0) {
      *offset_ptr = lVar4 + 1;
      sVar5 = lVar4 - uVar1;
      pcVar6 = __s;
    }
  }
  SVar7.Length = sVar5;
  SVar7.Data = pcVar6;
  return SVar7;
}

Assistant:

StringRef DataExtractor::getCStrRef(uint64_t *offset_ptr) const {
  uint64_t Start = *offset_ptr;
  StringRef::size_type Pos = Data.find('\0', Start);
  if (Pos != StringRef::npos) {
    *offset_ptr = Pos + 1;
    return StringRef(Data.data() + Start, Pos - Start);
  }
  return StringRef();
}